

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

bool check_deferring_event(Am_Object *inter,Am_Input_Char target_char,Am_Input_Char input_char)

{
  bool bVar1;
  undefined4 in_EAX;
  undefined8 uStack_8;
  
  if (((uint)inter & 0xe00000) == 0x400000) {
    uStack_8._0_6_ = CONCAT24((short)inter,in_EAX);
    uStack_8 = CONCAT26((short)((ulong)inter >> 0x10),(undefined6)uStack_8) & 0xff0fffffffffffff |
               0x10000000000000;
    if (((((uint)inter & 0xffff) != 0x103) == (((uint)target_char & 0xffff) != 0x103)) &&
       (bVar1 = Am_Input_Char::helper_check_equal
                          ((Am_Input_Char *)((long)&uStack_8 + 4),target_char), bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool
check_deferring_event(Am_Object &inter, Am_Input_Char target_char,
                      Am_Input_Char input_char)
{
  if (target_char.button_down == Am_BUTTON_CLICK ||
      target_char.button_down == Am_BUTTON_DRAG) {
    Am_Input_Char ic2 = target_char;
    ic2.button_down = Am_BUTTON_DOWN;
    if (ic2 == input_char) {
      Am_INTER_TRACE_PRINT_NOENDL(inter, "(click/drag match)");
      return true;
    }
  }
  return false;
}